

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plan_comparison_join.cpp
# Opt level: O2

PhysicalOperator * __thiscall
duckdb::PhysicalPlanGenerator::PlanComparisonJoin
          (PhysicalPlanGenerator *this,LogicalComparisonJoin *op)

{
  vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
  *this_00;
  undefined1 *args_4;
  vector<duckdb::JoinCondition,_true> *conditions;
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  pointer pJVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  reference pvVar8;
  pointer pLVar9;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  type pLVar10;
  PhysicalOperator *pPVar11;
  PhysicalOperator *args_2;
  ClientConfig *pCVar12;
  PhysicalHashJoin *pPVar13;
  type expr;
  uint uVar14;
  bool bVar15;
  JoinCondition *cond;
  pointer pJVar16;
  bool bVar17;
  undefined1 local_60 [16];
  pointer pJStack_50;
  pointer local_48;
  idx_t has_range;
  
  this_00 = &(op->super_LogicalJoin).super_LogicalOperator.children;
  pvVar8 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
           ::get<true>(this_00,0);
  pLVar9 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
           operator->(pvVar8);
  iVar6 = (*pLVar9->_vptr_LogicalOperator[7])(pLVar9,this->context);
  pvVar8 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
           ::get<true>(this_00,1);
  pLVar9 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
           operator->(pvVar8);
  iVar7 = (*pLVar9->_vptr_LogicalOperator[7])(pLVar9);
  pvVar8 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
           ::get<true>(this_00,0);
  pLVar10 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
            ::operator*(pvVar8);
  pPVar11 = CreatePlan(this,pLVar10);
  pvVar8 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
           ::get<true>(this_00,1);
  pLVar10 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
            ::operator*(pvVar8);
  args_2 = CreatePlan(this,pLVar10);
  pPVar11->estimated_cardinality = CONCAT44(extraout_var,iVar6);
  args_2->estimated_cardinality = CONCAT44(extraout_var_00,iVar7);
  if ((op->conditions).super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>.
      super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (op->conditions).super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>.
      super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pPVar11 = Make<duckdb::PhysicalCrossProduct,duckdb::vector<duckdb::LogicalType,true>&,duckdb::PhysicalOperator&,duckdb::PhysicalOperator&,unsigned_long&>
                        (this,&(op->super_LogicalJoin).super_LogicalOperator.types,pPVar11,args_2,
                         &(op->super_LogicalJoin).super_LogicalOperator.estimated_cardinality);
    return pPVar11;
  }
  has_range = 0;
  bVar5 = LogicalComparisonJoin::HasEquality(op,&has_range);
  bVar17 = has_range != 0;
  bVar15 = (this->recursive_cte_tables)._M_h._M_element_count == 0 && 1 < has_range;
  uVar14 = (uint)(byte)(op->super_LogicalJoin).super_LogicalOperator.field_0x61;
  if ((uVar14 < 0xb) && ((0x6e0U >> (uVar14 & 0x1f) & 1) != 0)) {
    if (has_range == 0) {
      bVar15 = false;
      bVar17 = false;
    }
    else {
      bVar17 = (long)(op->conditions).
                     super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>.
                     super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(op->conditions).
                     super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>.
                     super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>
                     ._M_impl.super__Vector_impl_data._M_start == 0x18;
      bVar15 = false;
    }
  }
  conditions = &op->conditions;
  args_4 = &(op->super_LogicalJoin).super_LogicalOperator.field_0x61;
  pCVar12 = ClientConfig::GetConfig(this->context);
  if ((bVar5) && ((pCVar12->prefer_range_joins & bVar15) == 0)) {
    pPVar11 = Make<duckdb::PhysicalHashJoin,duckdb::LogicalComparisonJoin&,duckdb::PhysicalOperator&,duckdb::PhysicalOperator&,duckdb::vector<duckdb::JoinCondition,true>,duckdb::JoinType&,duckdb::vector<unsigned_long,true>&,duckdb::vector<unsigned_long,true>&,duckdb::vector<duckdb::LogicalType,true>,unsigned_long&,duckdb::unique_ptr<duckdb::JoinFilterPushdownInfo,std::default_delete<duckdb::JoinFilterPushdownInfo>,true>>
                        (this,op,pPVar11,args_2,conditions,args_4,
                         &(op->super_LogicalJoin).left_projection_map,
                         &(op->super_LogicalJoin).right_projection_map,&op->mark_types,
                         &(op->super_LogicalJoin).super_LogicalOperator.estimated_cardinality,
                         &op->filter_pushdown);
    pPVar13 = PhysicalOperator::Cast<duckdb::PhysicalHashJoin>(pPVar11);
    ::std::
    vector<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>_>_>
    ::_M_move_assign(&(pPVar13->join_stats).
                      super_vector<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>_>_>
                     ,&(op->super_LogicalJoin).join_stats);
  }
  else {
    uVar1 = pPVar11->estimated_cardinality;
    uVar2 = pCVar12->nested_loop_join_threshold;
    uVar3 = args_2->estimated_cardinality;
    if (uVar2 >= uVar3 || uVar2 >= uVar1) {
      bVar15 = false;
    }
    if ((bool)((uVar2 < uVar3 && uVar2 < uVar1) & bVar17)) {
      if (bVar15 != false) {
        if (uVar3 <= pCVar12->merge_join_threshold) {
          bVar15 = false;
        }
        if (uVar1 <= pCVar12->merge_join_threshold) {
          bVar15 = false;
        }
      }
      if (bVar15 == false) {
        pPVar11 = Make<duckdb::PhysicalPiecewiseMergeJoin,duckdb::LogicalComparisonJoin&,duckdb::PhysicalOperator&,duckdb::PhysicalOperator&,duckdb::vector<duckdb::JoinCondition,true>,duckdb::JoinType&,unsigned_long&>
                            (this,op,pPVar11,args_2,conditions,args_4,
                             &(op->super_LogicalJoin).super_LogicalOperator.estimated_cardinality);
        return pPVar11;
      }
    }
    else if (bVar15 == false) {
      bVar17 = PhysicalNestedLoopJoin::IsSupported(conditions,*args_4);
      if (bVar17) {
        pPVar11 = Make<duckdb::PhysicalNestedLoopJoin,duckdb::LogicalComparisonJoin&,duckdb::PhysicalOperator&,duckdb::PhysicalOperator&,duckdb::vector<duckdb::JoinCondition,true>,duckdb::JoinType&,unsigned_long&>
                            (this,op,pPVar11,args_2,conditions,args_4,
                             &(op->super_LogicalJoin).super_LogicalOperator.estimated_cardinality);
        return pPVar11;
      }
      pJVar4 = (op->conditions).
               super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>.
               super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      for (pJVar16 = (op->conditions).
                     super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>.
                     super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>
                     ._M_impl.super__Vector_impl_data._M_start; pJVar16 != pJVar4;
          pJVar16 = pJVar16 + 1) {
        expr = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator*(&pJVar16->right);
        RewriteJoinCondition
                  (expr,((long)(pPVar11->types).
                               super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                               .
                               super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(pPVar11->types).
                              super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                              .
                              super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                              ._M_impl.super__Vector_impl_data._M_start) / 0x18);
      }
      local_60._8_8_ =
           (op->conditions).
           super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>.
           super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>._M_impl
           .super__Vector_impl_data._M_start;
      pJStack_50 = (op->conditions).
                   super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>.
                   super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
      local_48 = (op->conditions).
                 super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>.
                 super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage;
      (conditions->super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>).
      super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (op->conditions).super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>.
      super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (op->conditions).super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>.
      super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      JoinCondition::CreateExpression
                ((JoinCondition *)local_60,(vector<duckdb::JoinCondition,_true> *)(local_60 + 8));
      ::std::vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>::~vector
                ((vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_> *)
                 (local_60 + 8));
      pPVar11 = Make<duckdb::PhysicalBlockwiseNLJoin,duckdb::LogicalComparisonJoin&,duckdb::PhysicalOperator&,duckdb::PhysicalOperator&,duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,duckdb::JoinType&,unsigned_long&>
                          (this,op,pPVar11,args_2,
                           (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                            *)local_60,args_4,
                           &(op->super_LogicalJoin).super_LogicalOperator.estimated_cardinality);
      if ((Expression *)local_60._0_8_ == (Expression *)0x0) {
        return pPVar11;
      }
      (**(code **)(*(long *)local_60._0_8_ + 8))();
      return pPVar11;
    }
    pPVar11 = Make<duckdb::PhysicalIEJoin,duckdb::LogicalComparisonJoin&,duckdb::PhysicalOperator&,duckdb::PhysicalOperator&,duckdb::vector<duckdb::JoinCondition,true>,duckdb::JoinType&,unsigned_long&>
                        (this,op,pPVar11,args_2,conditions,args_4,
                         &(op->super_LogicalJoin).super_LogicalOperator.estimated_cardinality);
  }
  return pPVar11;
}

Assistant:

PhysicalOperator &PhysicalPlanGenerator::PlanComparisonJoin(LogicalComparisonJoin &op) {
	// now visit the children
	D_ASSERT(op.children.size() == 2);
	idx_t lhs_cardinality = op.children[0]->EstimateCardinality(context);
	idx_t rhs_cardinality = op.children[1]->EstimateCardinality(context);
	auto &left = CreatePlan(*op.children[0]);
	auto &right = CreatePlan(*op.children[1]);
	left.estimated_cardinality = lhs_cardinality;
	right.estimated_cardinality = rhs_cardinality;

	if (op.conditions.empty()) {
		// no conditions: insert a cross product
		return Make<PhysicalCrossProduct>(op.types, left, right, op.estimated_cardinality);
	}

	idx_t has_range = 0;
	bool has_equality = op.HasEquality(has_range);
	bool can_merge = has_range > 0;
	bool can_iejoin = has_range >= 2 && recursive_cte_tables.empty();
	switch (op.join_type) {
	case JoinType::SEMI:
	case JoinType::ANTI:
	case JoinType::RIGHT_ANTI:
	case JoinType::RIGHT_SEMI:
	case JoinType::MARK:
		can_merge = can_merge && op.conditions.size() == 1;
		can_iejoin = false;
		break;
	default:
		break;
	}
	auto &client_config = ClientConfig::GetConfig(context);

	//	TODO: Extend PWMJ to handle all comparisons and projection maps
	const auto prefer_range_joins = client_config.prefer_range_joins && can_iejoin;
	if (has_equality && !prefer_range_joins) {
		// Equality join with small number of keys : possible perfect join optimization
		auto &join = Make<PhysicalHashJoin>(op, left, right, std::move(op.conditions), op.join_type,
		                                    op.left_projection_map, op.right_projection_map, std::move(op.mark_types),
		                                    op.estimated_cardinality, std::move(op.filter_pushdown));
		join.Cast<PhysicalHashJoin>().join_stats = std::move(op.join_stats);
		return join;
	}

	D_ASSERT(op.left_projection_map.empty());
	if (left.estimated_cardinality <= client_config.nested_loop_join_threshold ||
	    right.estimated_cardinality <= client_config.nested_loop_join_threshold) {
		can_iejoin = false;
		can_merge = false;
	}

	if (can_merge && can_iejoin) {
		if (left.estimated_cardinality <= client_config.merge_join_threshold ||
		    right.estimated_cardinality <= client_config.merge_join_threshold) {
			can_iejoin = false;
		}
	}

	if (can_iejoin) {
		return Make<PhysicalIEJoin>(op, left, right, std::move(op.conditions), op.join_type, op.estimated_cardinality);
	}
	if (can_merge) {
		// range join: use piecewise merge join
		return Make<PhysicalPiecewiseMergeJoin>(op, left, right, std::move(op.conditions), op.join_type,
		                                        op.estimated_cardinality);
	}
	if (PhysicalNestedLoopJoin::IsSupported(op.conditions, op.join_type)) {
		// inequality join: use nested loop
		return Make<PhysicalNestedLoopJoin>(op, left, right, std::move(op.conditions), op.join_type,
		                                    op.estimated_cardinality);
	}

	for (auto &cond : op.conditions) {
		RewriteJoinCondition(*cond.right, left.types.size());
	}
	auto condition = JoinCondition::CreateExpression(std::move(op.conditions));
	return Make<PhysicalBlockwiseNLJoin>(op, left, right, std::move(condition), op.join_type, op.estimated_cardinality);
}